

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O3

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> * __thiscall
jsoncons::jsonpath::detail::
eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
::create_json<jsoncons::json_array_arg_t_const&,jsoncons::semantic_tag,std::allocator<char>>
          (eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
           *this,json_array_arg_t *args,semantic_tag *args_1,allocator<char> *args_2)

{
  semantic_tag sVar1;
  _Head_base<0UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_false>
  _Var2;
  pointer phVar3;
  pointer *__ptr;
  __uniq_ptr_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
  local_28;
  
  _Var2._M_head_impl =
       (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)operator_new(0x10);
  sVar1 = *args_1;
  phVar3 = (pointer)operator_new(0x20);
  *(undefined8 *)&(phVar3->super_heap_string_base<unsigned_long,_std::allocator<char>_>).field_0x8 =
       0;
  phVar3->p_ = (pointer)0x0;
  phVar3->length_ = 0;
  *(undefined1 *)&(_Var2._M_head_impl)->field_0 = 0xe;
  ((_Var2._M_head_impl)->field_0).common_.tag_ = sVar1;
  ((_Var2._M_head_impl)->field_0).byte_str_.ptr_ = phVar3;
  local_28._M_t.
  super__Tuple_impl<0UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
        )(tuple<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
          )_Var2._M_head_impl;
  std::
  vector<std::unique_ptr<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::default_delete<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>,std::allocator<std::unique_ptr<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::default_delete<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
  ::
  emplace_back<std::unique_ptr<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::default_delete<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
            ((vector<std::unique_ptr<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::default_delete<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>,std::allocator<std::unique_ptr<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::default_delete<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
              *)(this + 8),
             (unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
              *)&local_28);
  if ((_Tuple_impl<0UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
       )local_28._M_t.
        super__Tuple_impl<0UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_false>
        ._M_head_impl != (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x0) {
    std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
    ::operator()((default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)&local_28,
                 (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 local_28._M_t.
                 super__Tuple_impl<0UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_false>
                 ._M_head_impl);
  }
  return (_Head_base<0UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_false>
          )_Var2._M_head_impl;
}

Assistant:

Json* create_json(Args&& ... args)
        {
            auto temp = jsoncons::make_unique<Json>(std::forward<Args>(args)...);
            Json* ptr = temp.get();
            temp_json_values_.push_back(std::move(temp));
            return ptr;
        }